

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st2013.hpp
# Opt level: O0

void bcl::st2013::
     generate_transition_matrix_resize<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *tm)

{
  size_type sVar1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  size_t i;
  size_t n;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000138;
  vector<double,_std::allocator<double>_> *in_stack_00000140;
  undefined8 local_20;
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)unaff_retaddr,(size_type)in_RDI);
  for (local_20 = 0; local_20 < sVar1; local_20 = local_20 + 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[](in_RSI,local_20);
    std::vector<double,_std::allocator<double>_>::resize(unaff_retaddr,(size_type)in_RDI);
  }
  generate_transition_matrix<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
            (in_stack_00000140,in_stack_00000138);
  return;
}

Assistant:

static void generate_transition_matrix_resize(VEC const& weights, MAT& tm) {
    std::size_t n = weights.size();
    tm.resize(n);
    for (std::size_t i = 0; i < n; ++i) tm[i].resize(n);
    generate_transition_matrix(weights, tm);
  }